

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

uint32 __thiscall
Js::ES5ArrayTypeHandlerBase<int>::DeleteDownTo
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 first,
          PropertyOperationFlags propertyOperationFlags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  uint32 uVar7;
  uint local_34 [2];
  uint32 lastIndex;
  
  local_34[0] = (uint)((ulong)in_RAX >> 0x20);
  if ((arr->super_JavascriptArray).super_ArrayObject.length <= first) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x3a6,"(first < arr->GetLength())","first < arr->GetLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  TVar1 = (arr->super_JavascriptArray).super_ArrayObject.length;
  if (TVar1 - first < 5) {
    do {
      uVar7 = TVar1;
      if (uVar7 <= first) {
        return uVar7;
      }
      iVar4 = (*(arr->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2a])
                        (arr,(ulong)(uVar7 - 1),(ulong)propertyOperationFlags);
      TVar1 = uVar7 - 1;
    } while (iVar4 != 0);
  }
  else {
    if ((this->dataItemAttributes & 2) != 0) {
      uVar5 = IndexPropertyDescriptorMap::DeleteDownTo((this->indexPropertyMap).ptr,first);
      return uVar5;
    }
    bVar3 = IndexPropertyDescriptorMap::TryGetLastIndex((this->indexPropertyMap).ptr,local_34);
    uVar5 = local_34[0] + 1;
    if (local_34[0] < first) {
      uVar5 = first;
    }
    if (!bVar3) {
      uVar5 = first;
    }
    bVar3 = TryGetLastDataItemIndex(this,arr,uVar5,local_34);
    uVar7 = local_34[0] + 1;
    if (!bVar3) {
      uVar7 = uVar5;
    }
  }
  return uVar7;
}

Assistant:

uint32 ES5ArrayTypeHandlerBase<T>::DeleteDownTo(ES5Array* arr, uint32 first, PropertyOperationFlags propertyOperationFlags)
    {
        Assert(first < arr->GetLength()); // Only called when newLen < oldLen

        // If the number of elements to be deleted is small, iterate on it.
        uint32 count = arr->GetLength() - first;
        if (count < 5)
        {
            uint32 oldLen = arr->GetLength();
            while (first < oldLen)
            {
                if (!arr->DeleteItem(oldLen - 1, propertyOperationFlags))
                {
                    break;
                }
                --oldLen;
            }

            return oldLen;
        }

        // If data items are [[CanDelete]], check attribute map only.
        if (GetDataItemAttributes() & PropertyConfigurable)
        {
            return indexPropertyMap->DeleteDownTo(first);
        }
        else
        {
            // The array isSealed. No existing item can be deleted. Look for the max index.
            uint32 lastIndex;
            if (indexPropertyMap->TryGetLastIndex(&lastIndex) && lastIndex >= first)
            {
                first = lastIndex + 1;
            }
            if (TryGetLastDataItemIndex(arr, first, &lastIndex))
            {
                first = lastIndex + 1;
            }
            return first;
        }
    }